

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O1

int Abc_NtkDsdLocal(Abc_Ntk_t *pNtk,int fVerbose,int fRecursive)

{
  uint uVar1;
  DdManager *pDVar2;
  Abc_Obj_t *pAVar3;
  DdNode **ppDVar4;
  Abc_Ntk_t *pNtk_00;
  DdNode *f;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Dsd_Manager_t *pDsdMan;
  uint *__ptr;
  void *pvVar9;
  Vec_Ptr_t *pVVar10;
  Dsd_Node_t *pDVar11;
  DdNode *n;
  DdNode *pDVar12;
  Dsd_Node_t *p;
  Dsd_Node_t **__ptr_00;
  Abc_Obj_t *pAVar13;
  Abc_Obj_t *pNode;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int pCounters [11];
  int local_b4;
  long local_b0;
  Dsd_Manager_t *local_a8;
  Abc_Obj_t *local_a0;
  int local_94;
  ulong local_90;
  void *local_88;
  Abc_Ntk_t *local_80;
  DdNode *local_78;
  ulong local_70;
  uint local_68 [9];
  ulong uStack_44;
  
  pDVar2 = (DdManager *)pNtk->pManFunc;
  local_68[8] = 0;
  uStack_44 = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_94 = fVerbose;
  if ((pNtk->ntkFunc != ABC_FUNC_BDD) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDsd.c"
                  ,0x149,"int Abc_NtkDsdLocal(Abc_Ntk_t *, int, int)");
  }
  Abc_NtkMinimumBase(pNtk);
  pDsdMan = Dsd_ManagerStart(pDVar2,pDVar2->size,0);
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar9 = malloc(800);
  *(void **)(__ptr + 2) = pvVar9;
  pVVar10 = pNtk->vObjs;
  local_a8 = pDsdMan;
  if (0 < pVVar10->nSize) {
    lVar17 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar10->pArray[lVar17];
      if (((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
         (iVar5 = Abc_NodeIsForDsd(pAVar3), iVar5 != 0)) {
        uVar1 = __ptr[1];
        uVar6 = *__ptr;
        if (uVar1 == uVar6) {
          if ((int)uVar6 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar9 = malloc(0x80);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar15 = 0x10;
          }
          else {
            uVar15 = uVar6 * 2;
            if ((int)uVar15 <= (int)uVar6) goto LAB_00252c0d;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar9 = malloc((ulong)uVar6 << 4);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr + 2),(ulong)uVar6 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar9;
          *__ptr = uVar15;
        }
LAB_00252c0d:
        __ptr[1] = uVar1 + 1;
        *(Abc_Obj_t **)(*(long *)(__ptr + 2) + (long)(int)uVar1 * 8) = pAVar3;
        pDsdMan = local_a8;
      }
      lVar17 = lVar17 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar17 < pVVar10->nSize);
  }
  uVar16 = (ulong)__ptr[1];
  local_80 = pNtk;
  if (0 < (int)__ptr[1]) {
    lVar17 = 0;
    do {
      local_88 = *(void **)(__ptr + 2);
      pAVar3 = *(Abc_Obj_t **)((long)local_88 + lVar17 * 8);
      pDVar2 = (DdManager *)pAVar3->pNtk->pManFunc;
      pDVar11 = Dsd_DecomposeOne(pDsdMan,(DdNode *)(pAVar3->field_5).pData);
      if (fRecursive == 0) {
LAB_00252d82:
        local_b0 = lVar17;
        if (0 < (pAVar3->vFanins).nSize) {
          lVar14 = 0;
          do {
            iVar5 = *(int *)(pAVar3->pNtk->vObjs->pArray + (pAVar3->vFanins).pArray[lVar14]);
            p = Dsd_ManagerReadInput(pDsdMan,(int)lVar14);
            Dsd_NodeSetMark(p,iVar5);
            lVar14 = lVar14 + 1;
          } while (lVar14 < (pAVar3->vFanins).nSize);
        }
        __ptr_00 = Dsd_TreeCollectNodesDfsOne
                             (pDsdMan,(Dsd_Node_t *)((ulong)pDVar11 & 0xfffffffffffffffe),&local_b4)
        ;
        if (local_b4 < 1) {
          pAVar13 = (Abc_Obj_t *)0x0;
        }
        else {
          lVar17 = 0;
          do {
            pAVar13 = Abc_NtkDsdConstructNode(pDsdMan,__ptr_00[lVar17],pAVar3->pNtk,(int *)local_68)
            ;
            iVar5 = Abc_NodeIsForDsd(pAVar13);
            if ((fRecursive != 0) && (iVar5 != 0)) {
              uVar1 = __ptr[1];
              uVar6 = *__ptr;
              if (uVar1 == uVar6) {
                if ((int)uVar6 < 0x10) {
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar9 = malloc(0x80);
                  }
                  else {
                    pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
                  }
                  uVar15 = 0x10;
                }
                else {
                  uVar15 = uVar6 * 2;
                  if ((int)uVar15 <= (int)uVar6) goto LAB_00252e84;
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar9 = malloc((ulong)uVar6 << 4);
                  }
                  else {
                    pvVar9 = realloc(*(void **)(__ptr + 2),(ulong)uVar6 << 4);
                  }
                }
                *(void **)(__ptr + 2) = pvVar9;
                *__ptr = uVar15;
              }
LAB_00252e84:
              __ptr[1] = uVar1 + 1;
              *(Abc_Obj_t **)(*(long *)(__ptr + 2) + (long)(int)uVar1 * 8) = pAVar13;
              pDsdMan = local_a8;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < local_b4);
        }
        if (__ptr_00 != (Dsd_Node_t **)0x0) {
          free(__ptr_00);
        }
        if (pAVar13 == (Abc_Obj_t *)0x0) {
          __assert_fail("pRoot",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDsd.c"
                        ,0x1b0,
                        "void Abc_NodeDecompDsdAndMux(Abc_Obj_t *, Vec_Ptr_t *, Dsd_Manager_t *, int, int *)"
                       );
        }
        Abc_ObjRemoveFanins(pAVar3);
        Abc_ObjAddFanin(pAVar3,pAVar13);
        Cudd_RecursiveDeref(pDVar2,(DdNode *)(pAVar3->field_5).pData);
        pDVar12 = (DdNode *)((ulong)((uint)pDVar11 & 1) ^ (ulong)*pDVar2->vars);
        lVar17 = local_b0;
      }
      else {
        uVar6 = Dsd_NodeReadDecsNum((Dsd_Node_t *)((ulong)pDVar11 & 0xfffffffffffffffe));
        uVar1 = (pAVar3->vFanins).nSize;
        if (uVar6 != uVar1) goto LAB_00252d82;
        local_90 = uVar16;
        if ((int)uVar1 < 1) {
          lVar14 = -1;
        }
        else {
          local_78 = (DdNode *)(pAVar3->field_5).pData;
          iVar5 = -1;
          uVar16 = 0;
          iVar18 = 1000000;
          local_b0 = lVar17;
          local_70 = (ulong)uVar1;
          do {
            f = local_78;
            pDVar12 = pDVar2->vars[uVar16];
            n = Cudd_Cofactor(pDVar2,local_78,(DdNode *)((ulong)pDVar12 ^ 1));
            Cudd_Ref(n);
            pDVar12 = Cudd_Cofactor(pDVar2,f,pDVar12);
            Cudd_Ref(pDVar12);
            iVar7 = Cudd_SupportSize(pDVar2,n);
            local_a0 = (Abc_Obj_t *)CONCAT44(local_a0._4_4_,iVar7);
            iVar8 = Cudd_SupportSize(pDVar2,pDVar12);
            Cudd_RecursiveDeref(pDVar2,n);
            Cudd_RecursiveDeref(pDVar2,pDVar12);
            iVar8 = iVar8 + (int)local_a0;
            iVar7 = iVar18;
            if (iVar8 <= iVar18) {
              iVar7 = iVar8;
            }
            if (iVar8 < iVar18) {
              iVar5 = (int)uVar16;
            }
            uVar16 = uVar16 + 1;
            iVar18 = iVar7;
          } while (local_70 != uVar16);
          lVar14 = (long)iVar5;
          lVar17 = local_b0;
        }
        local_a0 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar14]];
        pAVar13 = Abc_NtkCloneObj(pAVar3);
        pDVar12 = Cudd_Cofactor(pDVar2,(DdNode *)(pAVar3->field_5).pData,
                                (DdNode *)((ulong)pDVar2->vars[lVar14] ^ 1));
        (pAVar13->field_5).pData = pDVar12;
        Cudd_Ref(pDVar12);
        Abc_NodeMinimumBase(pAVar13);
        iVar5 = Abc_NodeIsForDsd(pAVar13);
        if (iVar5 != 0) {
          uVar1 = *__ptr;
          if ((uint)local_90 == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (local_88 == (void *)0x0) {
                pvVar9 = malloc(0x80);
              }
              else {
                pvVar9 = realloc(local_88,0x80);
              }
              uVar6 = 0x10;
            }
            else {
              uVar6 = uVar1 * 2;
              if ((int)uVar6 <= (int)uVar1) goto LAB_00252fee;
              if (local_88 == (void *)0x0) {
                pvVar9 = malloc((ulong)uVar1 << 4);
              }
              else {
                pvVar9 = realloc(local_88,(ulong)uVar1 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar9;
            *__ptr = uVar6;
          }
LAB_00252fee:
          __ptr[1] = (int)local_90 + 1;
          *(Abc_Obj_t **)(*(long *)(__ptr + 2) + (long)(int)local_90 * 8) = pAVar13;
        }
        pNode = Abc_NtkCloneObj(pAVar3);
        pDVar12 = Cudd_Cofactor(pDVar2,(DdNode *)(pAVar3->field_5).pData,pDVar2->vars[lVar14]);
        (pNode->field_5).pData = pDVar12;
        Cudd_Ref(pDVar12);
        Abc_NodeMinimumBase(pNode);
        iVar5 = Abc_NodeIsForDsd(pNode);
        pDsdMan = local_a8;
        if (iVar5 != 0) {
          uVar1 = __ptr[1];
          uVar6 = *__ptr;
          if (uVar1 == uVar6) {
            if ((int)uVar6 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar9 = malloc(0x80);
              }
              else {
                pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar15 = 0x10;
            }
            else {
              uVar15 = uVar6 * 2;
              if ((int)uVar15 <= (int)uVar6) goto LAB_002530c3;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar9 = malloc((ulong)uVar6 << 4);
              }
              else {
                pvVar9 = realloc(*(void **)(__ptr + 2),(ulong)uVar6 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar9;
            *__ptr = uVar15;
          }
LAB_002530c3:
          __ptr[1] = uVar1 + 1;
          *(Abc_Obj_t **)(*(long *)(__ptr + 2) + (long)(int)uVar1 * 8) = pNode;
        }
        Abc_ObjRemoveFanins(pAVar3);
        Abc_ObjAddFanin(pAVar3,local_a0);
        Abc_ObjAddFanin(pAVar3,pNode);
        Abc_ObjAddFanin(pAVar3,pAVar13);
        Cudd_RecursiveDeref(pDVar2,(DdNode *)(pAVar3->field_5).pData);
        ppDVar4 = pDVar2->vars;
        pDVar12 = Cudd_bddIte(pDVar2,*ppDVar4,ppDVar4[1],ppDVar4[2]);
      }
      (pAVar3->field_5).pData = pDVar12;
      Cudd_Ref(pDVar12);
      lVar17 = lVar17 + 1;
      uVar16 = (ulong)(int)__ptr[1];
    } while (lVar17 < (long)uVar16);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  pNtk_00 = local_80;
  if (local_94 != 0) {
    puts("Number of non-decomposable functions:");
    uVar16 = 3;
    do {
      printf("Inputs = %d.  Functions = %6d.\n",uVar16 & 0xffffffff,(ulong)local_68[uVar16]);
      uVar16 = uVar16 + 1;
    } while (uVar16 != 10);
    printf("Inputs > %d.  Functions = %6d.\n",9,uStack_44 >> 0x20);
  }
  Dsd_ManagerStop(pDsdMan);
  iVar5 = Abc_NtkCheck(pNtk_00);
  if (iVar5 == 0) {
    puts("Abc_NtkDsdRecursive: The network check has failed.");
  }
  return (uint)(iVar5 != 0);
}

Assistant:

int Abc_NtkDsdLocal( Abc_Ntk_t * pNtk, int fVerbose, int fRecursive )
{
    Dsd_Manager_t * pManDsd;
    DdManager * dd = (DdManager *)pNtk->pManFunc;
    Vec_Ptr_t * vNodes;
    int i;
    int pCounters[11] = {0};

    assert( Abc_NtkIsBddLogic(pNtk) );

    // make the network minimum base
    Abc_NtkMinimumBase( pNtk );

    // start the DSD manager
    pManDsd = Dsd_ManagerStart( dd, dd->size, 0 );

    // collect nodes for decomposition
    vNodes = Abc_NtkCollectNodesForDsd( pNtk );
    for ( i = 0; i < vNodes->nSize; i++ )
        Abc_NodeDecompDsdAndMux( (Abc_Obj_t *)vNodes->pArray[i], vNodes, pManDsd, fRecursive, pCounters );
    Vec_PtrFree( vNodes );

    if ( fVerbose )
    {
        printf( "Number of non-decomposable functions:\n" );
        for ( i = 3; i < 10; i++ )
            printf( "Inputs = %d.  Functions = %6d.\n", i, pCounters[i] );
        printf( "Inputs > %d.  Functions = %6d.\n", 9, pCounters[10] );
    }

    // stop the DSD manager
    Dsd_ManagerStop( pManDsd );

    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkDsdRecursive: The network check has failed.\n" );
        return 0;
    }
    return 1;
}